

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx512::forward
          (BinaryOp_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Mat *pMVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  uint uVar42;
  Mat *m;
  uint *puVar43;
  int iVar44;
  uint uVar45;
  Option *opt_00;
  undefined1 (*pauVar46) [64];
  long lVar47;
  long lVar48;
  int iVar49;
  Mat *b;
  undefined1 (*pauVar50) [64];
  float *pfVar51;
  __m128 *pafVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  float fVar78;
  undefined1 auVar79 [16];
  undefined8 uVar82;
  undefined8 uVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined1 auVar92 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [56];
  undefined1 auVar95 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  __m128 afVar100;
  binary_op_rpow op_1;
  binary_op_ratan2 op;
  __m128 _b_1;
  __m128 _b;
  __m256 _b_avx;
  binary_op_rpow local_26b;
  ushort local_26a;
  long local_268;
  long local_260;
  uint local_254;
  Mat *local_250;
  Mat *local_248;
  binary_op_ratan2 local_240 [8];
  float afStack_238 [5];
  uint local_224;
  float local_220 [2];
  float afStack_218 [2];
  float afStack_210 [2];
  float afStack_208 [2];
  __m128 local_200;
  float afStack_1f0 [2];
  float afStack_1e8 [2];
  float afStack_1e0 [2];
  float afStack_1d8 [2];
  float afStack_1d0 [2];
  float afStack_1c8 [14];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  float afStack_170 [2];
  float afStack_168 [2];
  float afStack_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  __m256 local_140;
  float afStack_120 [2];
  float afStack_118 [2];
  float afStack_110 [2];
  float afStack_108 [2];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar83._0_4_ = pMVar4[1].d;
  uVar83._4_4_ = pMVar4[1].c;
  auVar79._8_8_ = uVar83;
  auVar79._0_8_ = uVar83;
  auVar98._0_4_ = pMVar4[1].w;
  auVar98._4_4_ = pMVar4[1].h;
  auVar98._8_4_ = pMVar4[1].d;
  auVar98._12_4_ = pMVar4[1].c;
  auVar98 = vpmulld_avx(auVar79,auVar98);
  auVar79 = vpshufd_avx(auVar98,0x55);
  auVar93 = ZEXT1664(auVar79);
  auVar98 = vpmulld_avx(auVar98,auVar79);
  iVar44 = auVar98._0_4_ * pMVar4[1].elempack;
  b = pMVar4 + 1;
  if (((pMVar4->dims < pMVar4[1].dims) && (iVar44 != 1)) ||
     (pMVar4->c * pMVar4->elempack * pMVar4->d * pMVar4->h * pMVar4->w < iVar44)) {
    uVar45 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3]);
    switch(uVar45) {
    case 1:
      uVar45 = 7;
      break;
    case 3:
      uVar45 = 8;
      break;
    case 6:
      uVar45 = 9;
      break;
    case 7:
      uVar45 = 1;
      break;
    case 8:
      uVar45 = 3;
      break;
    case 9:
      uVar45 = 6;
      break;
    case 10:
      uVar45 = 0xb;
      break;
    case 0xb:
      uVar45 = 10;
    }
    m = b;
    b = pMVar4;
  }
  else {
    uVar45 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx512[-3]);
    m = pMVar4;
  }
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar4,m,opt->blob_allocator);
  if (pMVar4->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar4->c * pMVar4->cstep == 0) {
    return -100;
  }
  uVar42 = b->elempack;
  opt_00 = (Option *)(ulong)uVar42;
  uVar41 = b->w;
  iVar44 = b->h;
  iVar49 = b->d;
  iVar1 = b->c;
  if (iVar49 * iVar1 * iVar44 * uVar41 * uVar42 == 1) {
    if (0xb < uVar45) {
      return 0;
    }
    fVar78 = *b->data;
    local_190 = ZEXT416((uint)fVar78);
    auVar98 = ZEXT416((uint)fVar78);
    local_250 = pMVar4;
    local_248 = m;
    switch(uVar45) {
    case 1:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar93 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar55 = vsubps_avx512f(*pauVar50,auVar93);
            *pauVar46 = auVar55;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar92 = vsubps_avx(*(undefined1 (*) [32])*pauVar50,auVar93._0_32_);
          *(undefined1 (*) [32])*pauVar46 = auVar92;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar98 = vsubps_avx(*(undefined1 (*) [16])*pauVar50,auVar93._0_16_);
          *(undefined1 (*) [16])*pauVar46 = auVar98;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            *(float *)((long)*pauVar46 + lVar47 * 4) = *(float *)(*pauVar50 + lVar47 * 4) - fVar78;
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 2:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar55 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar93 = vmulps_avx512f(auVar55,*pauVar50);
            *pauVar46 = auVar93;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar59._0_4_ = auVar55._0_4_ * *(float *)*pauVar50;
          auVar59._4_4_ = auVar55._4_4_ * *(float *)(*pauVar50 + 4);
          auVar59._8_4_ = auVar55._8_4_ * *(float *)(*pauVar50 + 8);
          auVar59._12_4_ = auVar55._12_4_ * *(float *)(*pauVar50 + 0xc);
          auVar59._16_4_ = auVar55._16_4_ * *(float *)(*pauVar50 + 0x10);
          auVar59._20_4_ = auVar55._20_4_ * *(float *)(*pauVar50 + 0x14);
          auVar59._28_36_ = auVar93._28_36_;
          auVar59._24_4_ = auVar55._24_4_ * *(float *)(*pauVar50 + 0x18);
          auVar93 = ZEXT3264(auVar59._0_32_);
          *(undefined1 (*) [32])*pauVar46 = auVar59._0_32_;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar91._0_4_ = auVar55._0_4_ * *(float *)*pauVar50;
          auVar91._4_4_ = auVar55._4_4_ * *(float *)(*pauVar50 + 4);
          auVar91._8_4_ = auVar55._8_4_ * *(float *)(*pauVar50 + 8);
          auVar91._12_4_ = auVar55._12_4_ * *(float *)(*pauVar50 + 0xc);
          auVar93 = ZEXT1664(auVar91);
          *(undefined1 (*) [16])*pauVar46 = auVar91;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            fVar38 = fVar78 * *(float *)(*pauVar50 + lVar47 * 4);
            auVar93 = ZEXT464((uint)fVar38);
            *(float *)((long)*pauVar46 + lVar47 * 4) = fVar38;
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 3:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar80._0_4_ = 1.0 / fVar78;
      auVar80._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar93 = vbroadcastss_avx512f(auVar80);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            in_ZMM2 = vmulps_avx512f(auVar93,*pauVar50);
            *pauVar46 = in_ZMM2;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar58._0_4_ = auVar93._0_4_ * *(float *)*pauVar50;
          auVar58._4_4_ = auVar93._4_4_ * *(float *)(*pauVar50 + 4);
          auVar58._8_4_ = auVar93._8_4_ * *(float *)(*pauVar50 + 8);
          auVar58._12_4_ = auVar93._12_4_ * *(float *)(*pauVar50 + 0xc);
          auVar58._16_4_ = auVar93._16_4_ * *(float *)(*pauVar50 + 0x10);
          auVar58._20_4_ = auVar93._20_4_ * *(float *)(*pauVar50 + 0x14);
          auVar58._28_36_ = in_ZMM2._28_36_;
          auVar58._24_4_ = auVar93._24_4_ * *(float *)(*pauVar50 + 0x18);
          in_ZMM2 = ZEXT3264(auVar58._0_32_);
          *(undefined1 (*) [32])*pauVar46 = auVar58._0_32_;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar95._0_4_ = auVar93._0_4_ * *(float *)*pauVar50;
          auVar95._4_4_ = auVar93._4_4_ * *(float *)(*pauVar50 + 4);
          auVar95._8_4_ = auVar93._8_4_ * *(float *)(*pauVar50 + 8);
          auVar95._12_4_ = auVar93._12_4_ * *(float *)(*pauVar50 + 0xc);
          in_ZMM2 = ZEXT1664(auVar95);
          *(undefined1 (*) [16])*pauVar46 = auVar95;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            fVar78 = auVar80._0_4_ * *(float *)(*pauVar50 + lVar47 * 4);
            in_ZMM2 = ZEXT464((uint)fVar78);
            *(float *)((long)*pauVar46 + lVar47 * 4) = fVar78;
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 4:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar93 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar55 = vmaxps_avx512f(auVar93,*pauVar50);
            *pauVar46 = auVar55;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar92 = vmaxps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar50);
          *(undefined1 (*) [32])*pauVar46 = auVar92;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar79 = vmaxps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar50);
          *(undefined1 (*) [16])*pauVar46 = auVar79;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            auVar79 = vmaxss_avx(auVar98,ZEXT416(*(uint *)(*pauVar50 + lVar47 * 4)));
            *(int *)((long)*pauVar46 + lVar47 * 4) = auVar79._0_4_;
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 5:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar93 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar55 = vminps_avx512f(auVar93,*pauVar50);
            *pauVar46 = auVar55;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar92 = vminps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar50);
          *(undefined1 (*) [32])*pauVar46 = auVar92;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar79 = vminps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar50);
          *(undefined1 (*) [16])*pauVar46 = auVar79;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            auVar79 = vminss_avx(auVar98,ZEXT416(*(uint *)(*pauVar50 + lVar47 * 4)));
            *(int *)((long)*pauVar46 + lVar47 * 4) = auVar79._0_4_;
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 6:
      local_268 = (long)m->c;
      if (local_268 < 1) {
        return 0;
      }
      iVar44 = m->h * m->w * m->d * m->elempack;
      _local_180 = vbroadcastss_avx512f(auVar98);
      local_260 = 0;
      do {
        auVar93 = _local_180;
        pafVar52 = (__m128 *)
                   (local_248->cstep * local_260 * local_248->elemsize + (long)local_248->data);
        pfVar51 = (float *)(local_250->cstep * local_260 * local_250->elemsize +
                           (long)local_250->data);
        local_140 = local_180._0_32_;
        afStack_120[0] = afStack_160[0];
        afStack_120[1] = afStack_160[1];
        afStack_118[0] = afStack_158[0];
        afStack_118[1] = afStack_158[1];
        afStack_110[0] = afStack_150[0];
        afStack_110[1] = afStack_150[1];
        afStack_108[0] = afStack_148[0];
        afStack_108[1] = afStack_148[1];
        if (iVar44 < 0x10) {
          uVar45 = 0;
          _local_180 = auVar93;
        }
        else {
          uVar42 = 0;
          _local_180 = auVar93;
          do {
            uVar83 = *(undefined8 *)*pafVar52;
            uVar82 = *(undefined8 *)(*pafVar52 + 2);
            local_200 = *pafVar52;
            uVar84 = *(undefined8 *)pafVar52[1];
            uVar85 = *(undefined8 *)(pafVar52[1] + 2);
            uVar86 = *(undefined8 *)pafVar52[2];
            uVar87 = *(undefined8 *)(pafVar52[2] + 2);
            uVar88 = *(undefined8 *)pafVar52[3];
            uVar89 = *(undefined8 *)(pafVar52[3] + 2);
            afStack_1f0 = (float  [2])uVar84;
            afStack_1e8 = (float  [2])uVar85;
            afStack_1e0 = (float  [2])uVar86;
            afStack_1d8 = (float  [2])uVar87;
            afStack_1d0 = (float  [2])uVar88;
            afStack_1c8._0_8_ = uVar89;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_26b,(__m512 *)local_200,(__m512 *)local_140);
            *(undefined8 *)pfVar51 = uVar83;
            *(undefined8 *)(pfVar51 + 2) = uVar82;
            *(undefined8 *)(pfVar51 + 4) = uVar84;
            *(undefined8 *)(pfVar51 + 6) = uVar85;
            *(undefined8 *)(pfVar51 + 8) = uVar86;
            *(undefined8 *)(pfVar51 + 10) = uVar87;
            *(undefined8 *)(pfVar51 + 0xc) = uVar88;
            *(undefined8 *)(pfVar51 + 0xe) = uVar89;
            pafVar52 = pafVar52 + 4;
            pfVar51 = pfVar51 + 0x10;
            uVar45 = uVar42 + 0x10;
            iVar49 = uVar42 + 0x1f;
            uVar42 = uVar45;
          } while (iVar49 < iVar44);
        }
        auVar93 = _local_180;
        local_200 = local_180;
        afStack_1f0[0] = afStack_170[0];
        afStack_1f0[1] = afStack_170[1];
        afStack_1e8[0] = afStack_168[0];
        afStack_1e8[1] = afStack_168[1];
        _local_180 = auVar93;
        if ((int)(uVar45 | 7) < iVar44) {
          uVar42 = uVar45;
          do {
            uVar83 = *(undefined8 *)*pafVar52;
            uVar82 = *(undefined8 *)(*pafVar52 + 2);
            uVar84 = *(undefined8 *)pafVar52[1];
            uVar85 = *(undefined8 *)(pafVar52[1] + 2);
            local_220 = (float  [2])uVar83;
            afStack_218 = (float  [2])uVar82;
            afStack_210 = (float  [2])uVar84;
            afStack_208 = (float  [2])uVar85;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                      ((binary_op_pow *)&local_26b,(__m256 *)local_220,(__m256 *)local_200);
            *(undefined8 *)pfVar51 = uVar83;
            *(undefined8 *)(pfVar51 + 2) = uVar82;
            *(undefined8 *)(pfVar51 + 4) = uVar84;
            *(undefined8 *)(pfVar51 + 6) = uVar85;
            pafVar52 = pafVar52 + 2;
            pfVar51 = pfVar51 + 8;
            uVar45 = uVar42 + 8;
            iVar49 = uVar42 + 0xf;
            uVar42 = uVar45;
          } while (iVar49 < iVar44);
        }
        uVar42 = uVar45 | 3;
        local_220 = (float  [2])local_180._0_8_;
        afStack_218 = (float  [2])local_180._8_8_;
        while ((int)uVar42 < iVar44) {
          local_240 = *(binary_op_ratan2 (*) [8])*pafVar52;
          uVar83 = *(undefined8 *)(*pafVar52 + 2);
          afStack_238._0_8_ = uVar83;
          afVar100 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                               ((binary_op_pow *)&local_26b,(__m128 *)local_240,(__m128 *)local_220)
          ;
          *(long *)pfVar51 = afVar100._0_8_;
          *(undefined8 *)(pfVar51 + 2) = uVar83;
          pafVar52 = pafVar52 + 1;
          pfVar51 = pfVar51 + 4;
          uVar42 = uVar45 + 7;
          uVar45 = uVar45 + 4;
        }
        if ((int)uVar45 < iVar44) {
          lVar48 = 0;
          do {
            fVar78 = powf((*pafVar52)[lVar48],local_190._0_4_);
            pfVar51[lVar48] = fVar78;
            lVar48 = lVar48 + 1;
          } while (iVar44 - uVar45 != (int)lVar48);
        }
        local_260 = local_260 + 1;
      } while (local_260 != local_268);
      return 0;
    case 7:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar93 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar55 = vsubps_avx512f(auVar93,*pauVar50);
            *pauVar46 = auVar55;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar92 = vsubps_avx(auVar93._0_32_,*(undefined1 (*) [32])*pauVar50);
          *(undefined1 (*) [32])*pauVar46 = auVar92;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar98 = vsubps_avx(auVar93._0_16_,*(undefined1 (*) [16])*pauVar50);
          *(undefined1 (*) [16])*pauVar46 = auVar98;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            *(float *)((long)*pauVar46 + lVar47 * 4) = fVar78 - *(float *)(*pauVar50 + lVar47 * 4);
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 8:
      iVar44 = m->c;
      if ((long)iVar44 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar93 = vbroadcastss_avx512f(auVar98);
      lVar48 = 0;
      do {
        pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
        pauVar46 = (undefined1 (*) [64])
                   (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar49 = 0xf;
          do {
            auVar55 = vrcp14ps_avx512f(*pauVar50);
            in_ZMM3 = vmulps_avx512f(auVar93,auVar55);
            auVar56 = vfmsub213ps_avx512f(*pauVar50,in_ZMM3,auVar93);
            auVar55 = vfnmadd213ps_avx512f(auVar56,auVar55,in_ZMM3);
            *pauVar46 = auVar55;
            pauVar50 = pauVar50 + 1;
            pauVar46 = pauVar46 + 1;
            iVar49 = iVar49 + 0x10;
            uVar42 = uVar45 & 0xfffffff0;
          } while (iVar49 < (int)uVar45);
        }
        uVar41 = uVar42 | 7;
        while ((int)uVar41 < (int)uVar45) {
          auVar92 = vrcpps_avx(*(undefined1 (*) [32])*pauVar50);
          auVar57._0_4_ = auVar93._0_4_ * auVar92._0_4_;
          auVar57._4_4_ = auVar93._4_4_ * auVar92._4_4_;
          auVar57._8_4_ = auVar93._8_4_ * auVar92._8_4_;
          auVar57._12_4_ = auVar93._12_4_ * auVar92._12_4_;
          auVar57._16_4_ = auVar93._16_4_ * auVar92._16_4_;
          auVar57._20_4_ = auVar93._20_4_ * auVar92._20_4_;
          auVar57._28_36_ = in_ZMM3._28_36_;
          auVar57._24_4_ = auVar93._24_4_ * auVar92._24_4_;
          auVar97 = auVar57._0_32_;
          in_ZMM3 = ZEXT3264(auVar97);
          auVar98 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar50,auVar97,auVar93._0_32_);
          auVar98 = vfnmadd213ps_fma(ZEXT1632(auVar98),auVar92,auVar97);
          *(undefined1 (*) [32])*pauVar46 = ZEXT1632(auVar98);
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
          uVar41 = uVar42 + 0xf;
          uVar42 = uVar42 + 8;
        }
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          auVar98 = vrcpps_avx(*(undefined1 (*) [16])*pauVar50);
          auVar96._0_4_ = auVar93._0_4_ * auVar98._0_4_;
          auVar96._4_4_ = auVar93._4_4_ * auVar98._4_4_;
          auVar96._8_4_ = auVar93._8_4_ * auVar98._8_4_;
          auVar96._12_4_ = auVar93._12_4_ * auVar98._12_4_;
          in_ZMM3 = ZEXT1664(auVar96);
          auVar79 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar50,auVar96,auVar93._0_16_);
          auVar98 = vfnmadd213ps_fma(auVar79,auVar98,auVar96);
          *(undefined1 (*) [16])*pauVar46 = auVar98;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
          lVar47 = 0;
          do {
            *(float *)((long)*pauVar46 + lVar47 * 4) = fVar78 / *(float *)(*pauVar50 + lVar47 * 4);
            lVar47 = lVar47 + 1;
          } while (uVar45 - uVar42 != (int)lVar47);
        }
        lVar48 = lVar48 + 1;
      } while (lVar48 != iVar44);
      return 0;
    case 9:
      local_268 = (long)m->c;
      if (local_268 < 1) {
        return 0;
      }
      iVar44 = m->h * m->w * m->d * m->elempack;
      _local_180 = vbroadcastss_avx512f(auVar98);
      local_260 = 0;
      do {
        auVar93 = _local_180;
        pafVar52 = (__m128 *)
                   (local_248->cstep * local_260 * local_248->elemsize + (long)local_248->data);
        pfVar51 = (float *)(local_250->cstep * local_260 * local_250->elemsize +
                           (long)local_250->data);
        local_140 = local_180._0_32_;
        afStack_120[0] = afStack_160[0];
        afStack_120[1] = afStack_160[1];
        afStack_118[0] = afStack_158[0];
        afStack_118[1] = afStack_158[1];
        afStack_110[0] = afStack_150[0];
        afStack_110[1] = afStack_150[1];
        afStack_108[0] = afStack_148[0];
        afStack_108[1] = afStack_148[1];
        if (iVar44 < 0x10) {
          uVar45 = 0;
          _local_180 = auVar93;
        }
        else {
          uVar42 = 0;
          _local_180 = auVar93;
          do {
            uVar83 = *(undefined8 *)*pafVar52;
            uVar82 = *(undefined8 *)(*pafVar52 + 2);
            local_200 = *pafVar52;
            uVar84 = *(undefined8 *)pafVar52[1];
            uVar85 = *(undefined8 *)(pafVar52[1] + 2);
            uVar86 = *(undefined8 *)pafVar52[2];
            uVar87 = *(undefined8 *)(pafVar52[2] + 2);
            uVar88 = *(undefined8 *)pafVar52[3];
            uVar89 = *(undefined8 *)(pafVar52[3] + 2);
            afStack_1f0 = (float  [2])uVar84;
            afStack_1e8 = (float  [2])uVar85;
            afStack_1e0 = (float  [2])uVar86;
            afStack_1d8 = (float  [2])uVar87;
            afStack_1d0 = (float  [2])uVar88;
            afStack_1c8._0_8_ = uVar89;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      (&local_26b,(__m512 *)local_200,(__m512 *)local_140);
            *(undefined8 *)pfVar51 = uVar83;
            *(undefined8 *)(pfVar51 + 2) = uVar82;
            *(undefined8 *)(pfVar51 + 4) = uVar84;
            *(undefined8 *)(pfVar51 + 6) = uVar85;
            *(undefined8 *)(pfVar51 + 8) = uVar86;
            *(undefined8 *)(pfVar51 + 10) = uVar87;
            *(undefined8 *)(pfVar51 + 0xc) = uVar88;
            *(undefined8 *)(pfVar51 + 0xe) = uVar89;
            pafVar52 = pafVar52 + 4;
            pfVar51 = pfVar51 + 0x10;
            uVar45 = uVar42 + 0x10;
            iVar49 = uVar42 + 0x1f;
            uVar42 = uVar45;
          } while (iVar49 < iVar44);
        }
        auVar93 = _local_180;
        local_200 = local_180;
        afStack_1f0[0] = afStack_170[0];
        afStack_1f0[1] = afStack_170[1];
        afStack_1e8[0] = afStack_168[0];
        afStack_1e8[1] = afStack_168[1];
        _local_180 = auVar93;
        if ((int)(uVar45 | 7) < iVar44) {
          uVar42 = uVar45;
          do {
            uVar83 = *(undefined8 *)*pafVar52;
            uVar82 = *(undefined8 *)(*pafVar52 + 2);
            uVar84 = *(undefined8 *)pafVar52[1];
            uVar85 = *(undefined8 *)(pafVar52[1] + 2);
            local_220 = (float  [2])uVar83;
            afStack_218 = (float  [2])uVar82;
            afStack_210 = (float  [2])uVar84;
            afStack_208 = (float  [2])uVar85;
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                      (&local_26b,(__m256 *)local_220,(__m256 *)local_200);
            *(undefined8 *)pfVar51 = uVar83;
            *(undefined8 *)(pfVar51 + 2) = uVar82;
            *(undefined8 *)(pfVar51 + 4) = uVar84;
            *(undefined8 *)(pfVar51 + 6) = uVar85;
            pafVar52 = pafVar52 + 2;
            pfVar51 = pfVar51 + 8;
            uVar45 = uVar42 + 8;
            iVar49 = uVar42 + 0xf;
            uVar42 = uVar45;
          } while (iVar49 < iVar44);
        }
        uVar42 = uVar45 | 3;
        local_220 = (float  [2])local_180._0_8_;
        afStack_218 = (float  [2])local_180._8_8_;
        while ((int)uVar42 < iVar44) {
          local_240 = *(binary_op_ratan2 (*) [8])*pafVar52;
          uVar83 = *(undefined8 *)(*pafVar52 + 2);
          afStack_238._0_8_ = uVar83;
          afVar100 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                               (&local_26b,(__m128 *)local_240,(__m128 *)local_220);
          *(long *)pfVar51 = afVar100._0_8_;
          *(undefined8 *)(pfVar51 + 2) = uVar83;
          pafVar52 = pafVar52 + 1;
          pfVar51 = pfVar51 + 4;
          uVar42 = uVar45 + 7;
          uVar45 = uVar45 + 4;
        }
        if ((int)uVar45 < iVar44) {
          lVar48 = 0;
          do {
            fVar78 = powf((float)local_190._0_4_,(*pafVar52)[lVar48]);
            pfVar51[lVar48] = fVar78;
            lVar48 = lVar48 + 1;
          } while (iVar44 - uVar45 != (int)lVar48);
        }
        local_260 = local_260 + 1;
      } while (local_260 != local_268);
      return 0;
    case 10:
      local_268 = (long)m->c;
      if (local_268 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      auVar56 = vbroadcastss_avx512f(auVar98);
      auVar93 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar55._8_4_ = 0x80000000;
      auVar55._0_8_ = 0x8000000080000000;
      auVar55._12_4_ = 0x80000000;
      auVar55._16_4_ = 0x80000000;
      auVar55._20_4_ = 0x80000000;
      auVar55._24_4_ = 0x80000000;
      auVar55._28_4_ = 0x80000000;
      auVar55._32_4_ = 0x80000000;
      auVar55._36_4_ = 0x80000000;
      auVar55._40_4_ = 0x80000000;
      auVar55._44_4_ = 0x80000000;
      auVar55._48_4_ = 0x80000000;
      auVar55._52_4_ = 0x80000000;
      auVar55._56_4_ = 0x80000000;
      auVar55._60_4_ = 0x80000000;
      auVar93 = vpternlogd_avx512f(auVar93,auVar56,auVar55,0xf8);
      auVar74 = ZEXT864(0);
      uVar53 = vcmpps_avx512f(auVar93,auVar74,1);
      auVar93 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      local_c0._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * auVar93._4_4_;
      local_c0._0_4_ = (uint)((byte)uVar53 & 1) * auVar93._0_4_;
      local_c0._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * auVar93._8_4_;
      local_c0._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * auVar93._12_4_;
      local_c0._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * auVar93._16_4_;
      local_c0._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * auVar93._20_4_;
      local_c0._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * auVar93._24_4_;
      local_c0._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * auVar93._28_4_;
      local_c0._32_4_ = (uint)((byte)(uVar53 >> 8) & 1) * auVar93._32_4_;
      local_c0._36_4_ = (uint)((byte)(uVar53 >> 9) & 1) * auVar93._36_4_;
      local_c0._40_4_ = (uint)((byte)(uVar53 >> 10) & 1) * auVar93._40_4_;
      local_c0._44_4_ = (uint)((byte)(uVar53 >> 0xb) & 1) * auVar93._44_4_;
      local_c0._48_4_ = (uint)((byte)(uVar53 >> 0xc) & 1) * auVar93._48_4_;
      local_c0._52_4_ = (uint)((byte)(uVar53 >> 0xd) & 1) * auVar93._52_4_;
      local_c0._56_4_ = (uint)((byte)(uVar53 >> 0xe) & 1) * auVar93._56_4_;
      local_c0._60_4_ = (uint)(byte)(uVar53 >> 0xf) * auVar93._60_4_;
      local_224 = uVar45 & 0xfffffff0;
      auVar81._0_4_ = 1.0 / fVar78;
      auVar81._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_100 = vbroadcastss_avx512f(auVar81);
      local_260 = 0;
      uVar53 = vcmpps_avx512f(auVar56,auVar74,1);
      uVar54 = vcmpps_avx512f(auVar56,auVar74,4);
      auVar93 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar55 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar60 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar61 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar62 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar63 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar64 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar67 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar99 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_26a = (ushort)uVar53;
      local_254 = CONCAT22(local_254._2_2_,(short)uVar54);
      _local_180 = auVar56;
      do {
        pauVar50 = (undefined1 (*) [64])
                   (local_248->cstep * local_260 * local_248->elemsize + (long)local_248->data);
        puVar43 = (uint *)(local_250->cstep * local_260 * local_250->elemsize +
                          (long)local_250->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar44 = 0xf;
          auVar68 = auVar56;
          do {
            auVar69 = *pauVar50;
            uVar39 = vcmpps_avx512f(auVar69,auVar74,1);
            auVar71._8_4_ = 0xc0490fdb;
            auVar71._0_8_ = 0xc0490fdbc0490fdb;
            auVar71._12_4_ = 0xc0490fdb;
            auVar71._16_4_ = 0xc0490fdb;
            auVar71._20_4_ = 0xc0490fdb;
            auVar71._24_4_ = 0xc0490fdb;
            auVar71._28_4_ = 0xc0490fdb;
            auVar71._32_4_ = 0xc0490fdb;
            auVar71._36_4_ = 0xc0490fdb;
            auVar71._40_4_ = 0xc0490fdb;
            auVar71._44_4_ = 0xc0490fdb;
            auVar71._48_4_ = 0xc0490fdb;
            auVar71._52_4_ = 0xc0490fdb;
            auVar71._56_4_ = 0xc0490fdb;
            auVar71._60_4_ = 0xc0490fdb;
            auVar70 = vblendmps_avx512f(auVar55,auVar71);
            bVar5 = (bool)((byte)uVar39 & 1);
            auVar56._0_4_ = (uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_;
            bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * auVar68._4_4_;
            bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar5 * auVar70._8_4_ | (uint)!bVar5 * auVar68._8_4_;
            bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar56._12_4_ = (uint)bVar5 * auVar70._12_4_ | (uint)!bVar5 * auVar68._12_4_;
            bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar56._16_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * auVar68._16_4_;
            bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar56._20_4_ = (uint)bVar5 * auVar70._20_4_ | (uint)!bVar5 * auVar68._20_4_;
            bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar56._24_4_ = (uint)bVar5 * auVar70._24_4_ | (uint)!bVar5 * auVar68._24_4_;
            bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar56._28_4_ = (uint)bVar5 * auVar70._28_4_ | (uint)!bVar5 * auVar68._28_4_;
            bVar5 = (bool)((byte)(uVar39 >> 8) & 1);
            auVar56._32_4_ = (uint)bVar5 * auVar70._32_4_ | (uint)!bVar5 * auVar68._32_4_;
            bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
            auVar56._36_4_ = (uint)bVar5 * auVar70._36_4_ | (uint)!bVar5 * auVar68._36_4_;
            bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
            auVar56._40_4_ = (uint)bVar5 * auVar70._40_4_ | (uint)!bVar5 * auVar68._40_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
            auVar56._44_4_ = (uint)bVar5 * auVar70._44_4_ | (uint)!bVar5 * auVar68._44_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
            auVar56._48_4_ = (uint)bVar5 * auVar70._48_4_ | (uint)!bVar5 * auVar68._48_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
            auVar56._52_4_ = (uint)bVar5 * auVar70._52_4_ | (uint)!bVar5 * auVar68._52_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
            auVar56._56_4_ = (uint)bVar5 * auVar70._56_4_ | (uint)!bVar5 * auVar68._56_4_;
            bVar5 = SUB81(uVar39 >> 0xf,0);
            auVar56._60_4_ = (uint)bVar5 * auVar70._60_4_ | (uint)!bVar5 * auVar68._60_4_;
            auVar68 = vmulps_avx512f(auVar69,local_100);
            auVar70 = vandps_avx512dq(auVar68,auVar57);
            uVar39 = vcmpps_avx512f(auVar58,auVar70,1);
            auVar71 = vmaxps_avx512f(auVar70,auVar58);
            auVar73._8_4_ = 0xbf800000;
            auVar73._0_8_ = 0xbf800000bf800000;
            auVar73._12_4_ = 0xbf800000;
            auVar73._16_4_ = 0xbf800000;
            auVar73._20_4_ = 0xbf800000;
            auVar73._24_4_ = 0xbf800000;
            auVar73._28_4_ = 0xbf800000;
            auVar73._32_4_ = 0xbf800000;
            auVar73._36_4_ = 0xbf800000;
            auVar73._40_4_ = 0xbf800000;
            auVar73._44_4_ = 0xbf800000;
            auVar73._48_4_ = 0xbf800000;
            auVar73._52_4_ = 0xbf800000;
            auVar73._56_4_ = 0xbf800000;
            auVar73._60_4_ = 0xbf800000;
            auVar72 = vblendmps_avx512f(auVar70,auVar73);
            bVar5 = (bool)((byte)uVar39 & 1);
            auVar75._0_4_ = (uint)bVar5 * auVar72._0_4_ | (uint)!bVar5 * auVar70._0_4_;
            bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar75._4_4_ = (uint)bVar5 * auVar72._4_4_ | (uint)!bVar5 * auVar70._4_4_;
            bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar75._8_4_ = (uint)bVar5 * auVar72._8_4_ | (uint)!bVar5 * auVar70._8_4_;
            bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar75._12_4_ = (uint)bVar5 * auVar72._12_4_ | (uint)!bVar5 * auVar70._12_4_;
            bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar75._16_4_ = (uint)bVar5 * auVar72._16_4_ | (uint)!bVar5 * auVar70._16_4_;
            bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar75._20_4_ = (uint)bVar5 * auVar72._20_4_ | (uint)!bVar5 * auVar70._20_4_;
            bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar75._24_4_ = (uint)bVar5 * auVar72._24_4_ | (uint)!bVar5 * auVar70._24_4_;
            bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar75._28_4_ = (uint)bVar5 * auVar72._28_4_ | (uint)!bVar5 * auVar70._28_4_;
            bVar21 = (byte)(uVar39 >> 8);
            bVar5 = (bool)(bVar21 & 1);
            auVar75._32_4_ = (uint)bVar5 * auVar72._32_4_ | (uint)!bVar5 * auVar70._32_4_;
            bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
            auVar75._36_4_ = (uint)bVar5 * auVar72._36_4_ | (uint)!bVar5 * auVar70._36_4_;
            bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
            auVar75._40_4_ = (uint)bVar5 * auVar72._40_4_ | (uint)!bVar5 * auVar70._40_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
            auVar75._44_4_ = (uint)bVar5 * auVar72._44_4_ | (uint)!bVar5 * auVar70._44_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
            auVar75._48_4_ = (uint)bVar5 * auVar72._48_4_ | (uint)!bVar5 * auVar70._48_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
            auVar75._52_4_ = (uint)bVar5 * auVar72._52_4_ | (uint)!bVar5 * auVar70._52_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
            auVar75._56_4_ = (uint)bVar5 * auVar72._56_4_ | (uint)!bVar5 * auVar70._56_4_;
            bVar5 = SUB81(uVar39 >> 0xf,0);
            auVar75._60_4_ = (uint)bVar5 * auVar72._60_4_ | (uint)!bVar5 * auVar70._60_4_;
            auVar70 = vrcp14ps_avx512f(auVar71);
            auVar72 = vmulps_avx512f(auVar75,auVar70);
            auVar71 = vfmsub213ps_avx512f(auVar71,auVar72,auVar75);
            auVar70 = vfnmadd213ps_avx512f(auVar71,auVar70,auVar72);
            auVar71 = vmulps_avx512f(auVar70,auVar70);
            auVar72 = vmulps_avx512f(auVar71,auVar71);
            auVar73 = vfmadd213ps_avx512f(auVar59,auVar72,auVar60);
            auVar73 = vfmadd213ps_avx512f(auVar73,auVar72,auVar61);
            auVar75 = vfmadd213ps_avx512f(auVar63,auVar72,auVar64);
            auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar65);
            auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar66);
            auVar73 = vfmadd213ps_avx512f(auVar73,auVar72,auVar62);
            auVar72 = vfmadd213ps_avx512f(auVar75,auVar72,auVar58);
            auVar71 = vfmadd231ps_avx512f(auVar72,auVar71,auVar73);
            auVar70 = vmulps_avx512f(auVar71,auVar70);
            uVar40 = vcmpps_avx512f(auVar69,auVar74,4);
            auVar71 = vaddps_avx512f(auVar70,auVar67);
            bVar5 = (bool)((byte)uVar39 & 1);
            auVar76._0_4_ = (uint)bVar5 * auVar71._0_4_ | (uint)!bVar5 * auVar70._0_4_;
            bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar76._4_4_ = (uint)bVar5 * auVar71._4_4_ | (uint)!bVar5 * auVar70._4_4_;
            bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar76._8_4_ = (uint)bVar5 * auVar71._8_4_ | (uint)!bVar5 * auVar70._8_4_;
            bVar5 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar76._12_4_ = (uint)bVar5 * auVar71._12_4_ | (uint)!bVar5 * auVar70._12_4_;
            bVar5 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar76._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * auVar70._16_4_;
            bVar5 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar76._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * auVar70._20_4_;
            bVar5 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar76._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * auVar70._24_4_;
            bVar5 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar76._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * auVar70._28_4_;
            bVar5 = (bool)(bVar21 & 1);
            auVar76._32_4_ = (uint)bVar5 * auVar71._32_4_ | (uint)!bVar5 * auVar70._32_4_;
            bVar5 = (bool)((byte)(uVar39 >> 9) & 1);
            auVar76._36_4_ = (uint)bVar5 * auVar71._36_4_ | (uint)!bVar5 * auVar70._36_4_;
            bVar5 = (bool)((byte)(uVar39 >> 10) & 1);
            auVar76._40_4_ = (uint)bVar5 * auVar71._40_4_ | (uint)!bVar5 * auVar70._40_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xb) & 1);
            auVar76._44_4_ = (uint)bVar5 * auVar71._44_4_ | (uint)!bVar5 * auVar70._44_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xc) & 1);
            auVar76._48_4_ = (uint)bVar5 * auVar71._48_4_ | (uint)!bVar5 * auVar70._48_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xd) & 1);
            auVar76._52_4_ = (uint)bVar5 * auVar71._52_4_ | (uint)!bVar5 * auVar70._52_4_;
            bVar5 = (bool)((byte)(uVar39 >> 0xe) & 1);
            auVar76._56_4_ = (uint)bVar5 * auVar71._56_4_ | (uint)!bVar5 * auVar70._56_4_;
            bVar5 = SUB81(uVar39 >> 0xf,0);
            auVar76._60_4_ = (uint)bVar5 * auVar71._60_4_ | (uint)!bVar5 * auVar70._60_4_;
            auVar68 = vpternlogd_avx512f(auVar76,auVar68,auVar93,0xf8);
            auVar70 = vaddps_avx512f(auVar68,auVar56);
            bVar5 = (bool)((byte)uVar53 & 1);
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar53 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar53 >> 6) & 1);
            bVar13 = (bool)((byte)(uVar53 >> 7) & 1);
            bVar14 = (bool)((byte)(uVar53 >> 8) & 1);
            bVar15 = (bool)((byte)(uVar53 >> 9) & 1);
            bVar16 = (bool)((byte)(uVar53 >> 10) & 1);
            bVar17 = (bool)((byte)(uVar53 >> 0xb) & 1);
            bVar18 = (bool)((byte)(uVar53 >> 0xc) & 1);
            bVar19 = (bool)((byte)(uVar53 >> 0xd) & 1);
            bVar20 = (bool)((byte)(uVar53 >> 0xe) & 1);
            bVar22 = SUB81(uVar53 >> 0xf,0);
            auVar69 = vpternlogd_avx512f(auVar69,auVar93,auVar99,0xea);
            bVar6 = (bool)((byte)uVar54 & 1);
            auVar77._0_4_ =
                 (uint)bVar6 * ((uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_) |
                 (uint)!bVar6 * auVar69._0_4_;
            bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
            auVar77._4_4_ =
                 (uint)bVar5 * ((uint)bVar7 * auVar70._4_4_ | (uint)!bVar7 * auVar68._4_4_) |
                 (uint)!bVar5 * auVar69._4_4_;
            bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
            auVar77._8_4_ =
                 (uint)bVar5 * ((uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * auVar68._8_4_) |
                 (uint)!bVar5 * auVar69._8_4_;
            bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
            auVar77._12_4_ =
                 (uint)bVar5 * ((uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * auVar68._12_4_) |
                 (uint)!bVar5 * auVar69._12_4_;
            bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
            auVar77._16_4_ =
                 (uint)bVar5 * ((uint)bVar10 * auVar70._16_4_ | (uint)!bVar10 * auVar68._16_4_) |
                 (uint)!bVar5 * auVar69._16_4_;
            bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
            auVar77._20_4_ =
                 (uint)bVar5 * ((uint)bVar11 * auVar70._20_4_ | (uint)!bVar11 * auVar68._20_4_) |
                 (uint)!bVar5 * auVar69._20_4_;
            bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
            auVar77._24_4_ =
                 (uint)bVar5 * ((uint)bVar12 * auVar70._24_4_ | (uint)!bVar12 * auVar68._24_4_) |
                 (uint)!bVar5 * auVar69._24_4_;
            bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
            auVar77._28_4_ =
                 (uint)bVar5 * ((uint)bVar13 * auVar70._28_4_ | (uint)!bVar13 * auVar68._28_4_) |
                 (uint)!bVar5 * auVar69._28_4_;
            bVar5 = (bool)((byte)(uVar54 >> 8) & 1);
            auVar77._32_4_ =
                 (uint)bVar5 * ((uint)bVar14 * auVar70._32_4_ | (uint)!bVar14 * auVar68._32_4_) |
                 (uint)!bVar5 * auVar69._32_4_;
            bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
            auVar77._36_4_ =
                 (uint)bVar5 * ((uint)bVar15 * auVar70._36_4_ | (uint)!bVar15 * auVar68._36_4_) |
                 (uint)!bVar5 * auVar69._36_4_;
            bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
            auVar77._40_4_ =
                 (uint)bVar5 * ((uint)bVar16 * auVar70._40_4_ | (uint)!bVar16 * auVar68._40_4_) |
                 (uint)!bVar5 * auVar69._40_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
            auVar77._44_4_ =
                 (uint)bVar5 * ((uint)bVar17 * auVar70._44_4_ | (uint)!bVar17 * auVar68._44_4_) |
                 (uint)!bVar5 * auVar69._44_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
            auVar77._48_4_ =
                 (uint)bVar5 * ((uint)bVar18 * auVar70._48_4_ | (uint)!bVar18 * auVar68._48_4_) |
                 (uint)!bVar5 * auVar69._48_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
            auVar77._52_4_ =
                 (uint)bVar5 * ((uint)bVar19 * auVar70._52_4_ | (uint)!bVar19 * auVar68._52_4_) |
                 (uint)!bVar5 * auVar69._52_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
            auVar77._56_4_ =
                 (uint)bVar5 * ((uint)bVar20 * auVar70._56_4_ | (uint)!bVar20 * auVar68._56_4_) |
                 (uint)!bVar5 * auVar69._56_4_;
            bVar5 = SUB81(uVar54 >> 0xf,0);
            auVar77._60_4_ =
                 (uint)bVar5 * ((uint)bVar22 * auVar70._60_4_ | (uint)!bVar22 * auVar68._60_4_) |
                 (uint)!bVar5 * auVar69._60_4_;
            auVar68 = vblendmps_avx512f(local_c0,auVar77);
            bVar5 = (bool)((byte)uVar40 & 1);
            bVar6 = (bool)((byte)(uVar40 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar40 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar40 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar40 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar40 >> 6) & 1);
            bVar12 = (bool)((byte)(uVar40 >> 7) & 1);
            bVar13 = (bool)((byte)(uVar40 >> 8) & 1);
            bVar14 = (bool)((byte)(uVar40 >> 9) & 1);
            bVar15 = (bool)((byte)(uVar40 >> 10) & 1);
            bVar16 = (bool)((byte)(uVar40 >> 0xb) & 1);
            bVar17 = (bool)((byte)(uVar40 >> 0xc) & 1);
            bVar18 = (bool)((byte)(uVar40 >> 0xd) & 1);
            bVar19 = (bool)((byte)(uVar40 >> 0xe) & 1);
            bVar20 = SUB81(uVar40 >> 0xf,0);
            *puVar43 = (uint)bVar5 * auVar68._0_4_ | !bVar5 * auVar77._0_4_;
            puVar43[1] = (uint)bVar6 * auVar68._4_4_ | !bVar6 * auVar77._4_4_;
            puVar43[2] = (uint)bVar7 * auVar68._8_4_ | !bVar7 * auVar77._8_4_;
            puVar43[3] = (uint)bVar8 * auVar68._12_4_ | !bVar8 * auVar77._12_4_;
            puVar43[4] = (uint)bVar9 * auVar68._16_4_ | !bVar9 * auVar77._16_4_;
            puVar43[5] = (uint)bVar10 * auVar68._20_4_ | !bVar10 * auVar77._20_4_;
            puVar43[6] = (uint)bVar11 * auVar68._24_4_ | !bVar11 * auVar77._24_4_;
            puVar43[7] = (uint)bVar12 * auVar68._28_4_ | !bVar12 * auVar77._28_4_;
            puVar43[8] = (uint)bVar13 * auVar68._32_4_ | !bVar13 * auVar77._32_4_;
            puVar43[9] = (uint)bVar14 * auVar68._36_4_ | !bVar14 * auVar77._36_4_;
            puVar43[10] = (uint)bVar15 * auVar68._40_4_ | !bVar15 * auVar77._40_4_;
            puVar43[0xb] = (uint)bVar16 * auVar68._44_4_ | !bVar16 * auVar77._44_4_;
            puVar43[0xc] = (uint)bVar17 * auVar68._48_4_ | !bVar17 * auVar77._48_4_;
            puVar43[0xd] = (uint)bVar18 * auVar68._52_4_ | !bVar18 * auVar77._52_4_;
            puVar43[0xe] = (uint)bVar19 * auVar68._56_4_ | !bVar19 * auVar77._56_4_;
            puVar43[0xf] = (uint)bVar20 * auVar68._60_4_ | !bVar20 * auVar77._60_4_;
            pauVar50 = pauVar50 + 1;
            puVar43 = puVar43 + 0x10;
            iVar44 = iVar44 + 0x10;
            auVar68 = auVar56;
            uVar42 = local_224;
          } while (iVar44 < (int)uVar45);
        }
        local_140 = local_180._0_32_;
        if ((int)(uVar42 | 7) < (int)uVar45) {
          uVar41 = uVar42;
          do {
            uVar83 = *(undefined8 *)*pauVar50;
            uVar82 = *(undefined8 *)(*pauVar50 + 8);
            local_200 = *(__m128 *)*pauVar50;
            uVar84 = *(undefined8 *)(*pauVar50 + 0x10);
            uVar85 = *(undefined8 *)(*pauVar50 + 0x18);
            afStack_1f0 = (float  [2])uVar84;
            afStack_1e8 = (float  [2])uVar85;
            BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                      ((binary_op_atan2 *)local_240,(__m256 *)local_200,&local_140);
            *(undefined8 *)puVar43 = uVar83;
            *(undefined8 *)(puVar43 + 2) = uVar82;
            *(undefined8 *)(puVar43 + 4) = uVar84;
            *(undefined8 *)(puVar43 + 6) = uVar85;
            pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
            puVar43 = puVar43 + 8;
            uVar42 = uVar41 + 8;
            iVar44 = uVar41 + 0xf;
            uVar41 = uVar42;
          } while (iVar44 < (int)uVar45);
        }
        local_200 = local_180;
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          local_220 = *(float (*) [2])*pauVar50;
          uVar83 = *(undefined8 *)(*pauVar50 + 8);
          auVar94 = ZEXT856(auVar56._8_8_);
          afStack_218 = (float  [2])uVar83;
          afVar100 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                               ((binary_op_atan2 *)local_240,(__m128 *)local_220,&local_200);
          auVar56._0_8_ = afVar100._8_8_;
          auVar56._8_56_ = auVar94;
          *(long *)puVar43 = afVar100._0_8_;
          *(undefined8 *)(puVar43 + 2) = uVar83;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          puVar43 = puVar43 + 4;
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if ((int)uVar42 < (int)uVar45) {
          lVar48 = 0;
          do {
            auVar56 = ZEXT1664(local_190);
            fVar78 = atan2f(*(float *)(*pauVar50 + lVar48 * 4),local_190._0_4_);
            puVar43[lVar48] = (uint)fVar78;
            lVar48 = lVar48 + 1;
          } while (uVar45 - uVar42 != (int)lVar48);
        }
        local_260 = local_260 + 1;
        auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar53 = (ulong)local_26a;
        uVar54 = (ulong)(ushort)local_254;
        auVar93 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar55 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar59 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar60 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar61 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar62 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar63 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar64 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar65 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar66 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar67 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar99 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      } while (local_260 != local_268);
      return 0;
    case 0xb:
      local_268 = (long)m->c;
      if (local_268 < 1) {
        return 0;
      }
      uVar45 = m->h * m->w * m->d * m->elempack;
      _local_180 = vbroadcastss_avx512f(local_190);
      auVar99 = ZEXT864(0);
      uVar53 = vcmpps_avx512f(_local_180,auVar99,1);
      auVar93 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar55 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
      bVar5 = (bool)((byte)uVar53 & 1);
      local_c0._0_4_ = (uint)bVar5 * auVar55._0_4_ | (uint)!bVar5 * auVar93._0_4_;
      bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
      local_c0._4_4_ = (uint)bVar5 * auVar55._4_4_ | (uint)!bVar5 * auVar93._4_4_;
      bVar5 = (bool)((byte)(uVar53 >> 2) & 1);
      local_c0._8_4_ = (uint)bVar5 * auVar55._8_4_ | (uint)!bVar5 * auVar93._8_4_;
      bVar5 = (bool)((byte)(uVar53 >> 3) & 1);
      local_c0._12_4_ = (uint)bVar5 * auVar55._12_4_ | (uint)!bVar5 * auVar93._12_4_;
      bVar5 = (bool)((byte)(uVar53 >> 4) & 1);
      local_c0._16_4_ = (uint)bVar5 * auVar55._16_4_ | (uint)!bVar5 * auVar93._16_4_;
      bVar5 = (bool)((byte)(uVar53 >> 5) & 1);
      local_c0._20_4_ = (uint)bVar5 * auVar55._20_4_ | (uint)!bVar5 * auVar93._20_4_;
      bVar5 = (bool)((byte)(uVar53 >> 6) & 1);
      local_c0._24_4_ = (uint)bVar5 * auVar55._24_4_ | (uint)!bVar5 * auVar93._24_4_;
      bVar5 = (bool)((byte)(uVar53 >> 7) & 1);
      local_c0._28_4_ = (uint)bVar5 * auVar55._28_4_ | (uint)!bVar5 * auVar93._28_4_;
      bVar5 = (bool)((byte)(uVar53 >> 8) & 1);
      local_c0._32_4_ = (uint)bVar5 * auVar55._32_4_ | (uint)!bVar5 * auVar93._32_4_;
      bVar5 = (bool)((byte)(uVar53 >> 9) & 1);
      local_c0._36_4_ = (uint)bVar5 * auVar55._36_4_ | (uint)!bVar5 * auVar93._36_4_;
      bVar5 = (bool)((byte)(uVar53 >> 10) & 1);
      local_c0._40_4_ = (uint)bVar5 * auVar55._40_4_ | (uint)!bVar5 * auVar93._40_4_;
      bVar5 = (bool)((byte)(uVar53 >> 0xb) & 1);
      local_c0._44_4_ = (uint)bVar5 * auVar55._44_4_ | (uint)!bVar5 * auVar93._44_4_;
      bVar5 = (bool)((byte)(uVar53 >> 0xc) & 1);
      local_c0._48_4_ = (uint)bVar5 * auVar55._48_4_ | (uint)!bVar5 * auVar93._48_4_;
      bVar5 = (bool)((byte)(uVar53 >> 0xd) & 1);
      local_c0._52_4_ = (uint)bVar5 * auVar55._52_4_ | (uint)!bVar5 * auVar93._52_4_;
      bVar5 = (bool)((byte)(uVar53 >> 0xe) & 1);
      local_c0._56_4_ = (uint)bVar5 * auVar55._56_4_ | (uint)!bVar5 * auVar93._56_4_;
      bVar5 = SUB81(uVar53 >> 0xf,0);
      local_c0._60_4_ = (uint)bVar5 * auVar55._60_4_ | (uint)!bVar5 * auVar93._60_4_;
      auVar55 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar93._8_4_ = 0x80000000;
      auVar93._0_8_ = 0x8000000080000000;
      auVar93._12_4_ = 0x80000000;
      auVar93._16_4_ = 0x80000000;
      auVar93._20_4_ = 0x80000000;
      auVar93._24_4_ = 0x80000000;
      auVar93._28_4_ = 0x80000000;
      auVar93._32_4_ = 0x80000000;
      auVar93._36_4_ = 0x80000000;
      auVar93._40_4_ = 0x80000000;
      auVar93._44_4_ = 0x80000000;
      auVar93._48_4_ = 0x80000000;
      auVar93._52_4_ = 0x80000000;
      auVar93._56_4_ = 0x80000000;
      auVar93._60_4_ = 0x80000000;
      auVar93 = vpternlogd_avx512f(auVar55,_local_180,auVar93,0xf8);
      local_254 = uVar45 & 0xfffffff0;
      local_260 = 0;
      uVar53 = vcmpps_avx512f(_local_180,auVar99,4);
      auVar55 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar56 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar60 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar61 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar62 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar63 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar64 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_100 = vmovdqa64_avx512f(auVar93);
      local_26a = (ushort)uVar53;
      do {
        pauVar50 = (undefined1 (*) [64])
                   (local_248->cstep * local_260 * local_248->elemsize + (long)local_248->data);
        puVar43 = (uint *)(local_250->cstep * local_260 * local_250->elemsize +
                          (long)local_250->data);
        if ((int)uVar45 < 0x10) {
          uVar42 = 0;
        }
        else {
          iVar44 = 0xf;
          do {
            auVar74 = *pauVar50;
            auVar68 = vrcp14ps_avx512f(auVar74);
            auVar69 = vmulps_avx512f(_local_180,auVar68);
            auVar70 = vfmsub213ps_avx512f(auVar69,auVar74,_local_180);
            auVar69 = vfnmadd213ps_avx512f(auVar70,auVar68,auVar69);
            auVar70 = vandps_avx512dq(auVar69,auVar56);
            uVar54 = vcmpps_avx512f(auVar57,auVar70,1);
            auVar71 = vmaxps_avx512f(auVar70,auVar57);
            auVar68._8_4_ = 0xbf800000;
            auVar68._0_8_ = 0xbf800000bf800000;
            auVar68._12_4_ = 0xbf800000;
            auVar68._16_4_ = 0xbf800000;
            auVar68._20_4_ = 0xbf800000;
            auVar68._24_4_ = 0xbf800000;
            auVar68._28_4_ = 0xbf800000;
            auVar68._32_4_ = 0xbf800000;
            auVar68._36_4_ = 0xbf800000;
            auVar68._40_4_ = 0xbf800000;
            auVar68._44_4_ = 0xbf800000;
            auVar68._48_4_ = 0xbf800000;
            auVar68._52_4_ = 0xbf800000;
            auVar68._56_4_ = 0xbf800000;
            auVar68._60_4_ = 0xbf800000;
            auVar68 = vblendmps_avx512f(auVar70,auVar68);
            bVar5 = (bool)((byte)uVar54 & 1);
            auVar72._0_4_ = (uint)bVar5 * auVar68._0_4_ | (uint)!bVar5 * auVar70._0_4_;
            bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
            auVar72._4_4_ = (uint)bVar5 * auVar68._4_4_ | (uint)!bVar5 * auVar70._4_4_;
            bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
            auVar72._8_4_ = (uint)bVar5 * auVar68._8_4_ | (uint)!bVar5 * auVar70._8_4_;
            bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
            auVar72._12_4_ = (uint)bVar5 * auVar68._12_4_ | (uint)!bVar5 * auVar70._12_4_;
            bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
            auVar72._16_4_ = (uint)bVar5 * auVar68._16_4_ | (uint)!bVar5 * auVar70._16_4_;
            bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
            auVar72._20_4_ = (uint)bVar5 * auVar68._20_4_ | (uint)!bVar5 * auVar70._20_4_;
            bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
            auVar72._24_4_ = (uint)bVar5 * auVar68._24_4_ | (uint)!bVar5 * auVar70._24_4_;
            bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
            auVar72._28_4_ = (uint)bVar5 * auVar68._28_4_ | (uint)!bVar5 * auVar70._28_4_;
            bVar21 = (byte)(uVar54 >> 8);
            bVar5 = (bool)(bVar21 & 1);
            auVar72._32_4_ = (uint)bVar5 * auVar68._32_4_ | (uint)!bVar5 * auVar70._32_4_;
            bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
            auVar72._36_4_ = (uint)bVar5 * auVar68._36_4_ | (uint)!bVar5 * auVar70._36_4_;
            bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
            auVar72._40_4_ = (uint)bVar5 * auVar68._40_4_ | (uint)!bVar5 * auVar70._40_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
            auVar72._44_4_ = (uint)bVar5 * auVar68._44_4_ | (uint)!bVar5 * auVar70._44_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
            auVar72._48_4_ = (uint)bVar5 * auVar68._48_4_ | (uint)!bVar5 * auVar70._48_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
            auVar72._52_4_ = (uint)bVar5 * auVar68._52_4_ | (uint)!bVar5 * auVar70._52_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
            auVar72._56_4_ = (uint)bVar5 * auVar68._56_4_ | (uint)!bVar5 * auVar70._56_4_;
            bVar5 = SUB81(uVar54 >> 0xf,0);
            auVar72._60_4_ = (uint)bVar5 * auVar68._60_4_ | (uint)!bVar5 * auVar70._60_4_;
            auVar68 = vrcp14ps_avx512f(auVar71);
            auVar70 = vmulps_avx512f(auVar72,auVar68);
            auVar71 = vfmsub213ps_avx512f(auVar71,auVar70,auVar72);
            auVar68 = vfnmadd213ps_avx512f(auVar71,auVar68,auVar70);
            auVar70 = vmulps_avx512f(auVar68,auVar68);
            uVar39 = vcmpps_avx512f(auVar74,auVar99,4);
            auVar71 = vmulps_avx512f(auVar70,auVar70);
            auVar72 = vfmadd213ps_avx512f(auVar58,auVar71,auVar59);
            auVar72 = vfmadd213ps_avx512f(auVar72,auVar71,auVar60);
            auVar73 = vfmadd213ps_avx512f(auVar62,auVar71,auVar63);
            auVar73 = vfmadd213ps_avx512f(auVar73,auVar71,auVar64);
            auVar72 = vfmadd213ps_avx512f(auVar72,auVar71,auVar61);
            auVar73 = vfmadd213ps_avx512f(auVar73,auVar71,auVar65);
            auVar71 = vfmadd213ps_avx512f(auVar73,auVar71,auVar57);
            auVar70 = vfmadd231ps_avx512f(auVar71,auVar70,auVar72);
            uVar40 = vcmpps_avx512f(auVar74,auVar99,1);
            auVar68 = vmulps_avx512f(auVar70,auVar68);
            auVar71 = vaddps_avx512f(auVar68,auVar66);
            bVar5 = (bool)((byte)uVar54 & 1);
            auVar70._0_4_ = (uint)bVar5 * auVar71._0_4_ | (uint)!bVar5 * auVar68._0_4_;
            bVar5 = (bool)((byte)(uVar54 >> 1) & 1);
            auVar70._4_4_ = (uint)bVar5 * auVar71._4_4_ | (uint)!bVar5 * auVar68._4_4_;
            bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
            auVar70._8_4_ = (uint)bVar5 * auVar71._8_4_ | (uint)!bVar5 * auVar68._8_4_;
            bVar5 = (bool)((byte)(uVar54 >> 3) & 1);
            auVar70._12_4_ = (uint)bVar5 * auVar71._12_4_ | (uint)!bVar5 * auVar68._12_4_;
            bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
            auVar70._16_4_ = (uint)bVar5 * auVar71._16_4_ | (uint)!bVar5 * auVar68._16_4_;
            bVar5 = (bool)((byte)(uVar54 >> 5) & 1);
            auVar70._20_4_ = (uint)bVar5 * auVar71._20_4_ | (uint)!bVar5 * auVar68._20_4_;
            bVar5 = (bool)((byte)(uVar54 >> 6) & 1);
            auVar70._24_4_ = (uint)bVar5 * auVar71._24_4_ | (uint)!bVar5 * auVar68._24_4_;
            bVar5 = (bool)((byte)(uVar54 >> 7) & 1);
            auVar70._28_4_ = (uint)bVar5 * auVar71._28_4_ | (uint)!bVar5 * auVar68._28_4_;
            bVar5 = (bool)(bVar21 & 1);
            auVar70._32_4_ = (uint)bVar5 * auVar71._32_4_ | (uint)!bVar5 * auVar68._32_4_;
            bVar5 = (bool)((byte)(uVar54 >> 9) & 1);
            auVar70._36_4_ = (uint)bVar5 * auVar71._36_4_ | (uint)!bVar5 * auVar68._36_4_;
            bVar5 = (bool)((byte)(uVar54 >> 10) & 1);
            auVar70._40_4_ = (uint)bVar5 * auVar71._40_4_ | (uint)!bVar5 * auVar68._40_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xb) & 1);
            auVar70._44_4_ = (uint)bVar5 * auVar71._44_4_ | (uint)!bVar5 * auVar68._44_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xc) & 1);
            auVar70._48_4_ = (uint)bVar5 * auVar71._48_4_ | (uint)!bVar5 * auVar68._48_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xd) & 1);
            auVar70._52_4_ = (uint)bVar5 * auVar71._52_4_ | (uint)!bVar5 * auVar68._52_4_;
            bVar5 = (bool)((byte)(uVar54 >> 0xe) & 1);
            auVar70._56_4_ = (uint)bVar5 * auVar71._56_4_ | (uint)!bVar5 * auVar68._56_4_;
            bVar5 = SUB81(uVar54 >> 0xf,0);
            auVar70._60_4_ = (uint)bVar5 * auVar71._60_4_ | (uint)!bVar5 * auVar68._60_4_;
            auVar74 = vpternlogd_avx512f(auVar74,auVar55,auVar67,0xea);
            auVar68 = vpternlogd_avx512f(auVar70,auVar69,auVar55,0xf8);
            uVar54 = vcmpps_avx512f(auVar74,auVar99,1);
            auVar74 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar70 = vaddps_avx512f(auVar68,local_c0);
            bVar5 = (bool)((byte)uVar40 & 1);
            auVar69._0_4_ = (uint)bVar5 * auVar70._0_4_ | (uint)!bVar5 * auVar68._0_4_;
            bVar5 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar5 * auVar70._4_4_ | (uint)!bVar5 * auVar68._4_4_;
            bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar5 * auVar70._8_4_ | (uint)!bVar5 * auVar68._8_4_;
            bVar5 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar69._12_4_ = (uint)bVar5 * auVar70._12_4_ | (uint)!bVar5 * auVar68._12_4_;
            bVar5 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar69._16_4_ = (uint)bVar5 * auVar70._16_4_ | (uint)!bVar5 * auVar68._16_4_;
            bVar5 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar69._20_4_ = (uint)bVar5 * auVar70._20_4_ | (uint)!bVar5 * auVar68._20_4_;
            bVar5 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar69._24_4_ = (uint)bVar5 * auVar70._24_4_ | (uint)!bVar5 * auVar68._24_4_;
            bVar5 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar69._28_4_ = (uint)bVar5 * auVar70._28_4_ | (uint)!bVar5 * auVar68._28_4_;
            bVar5 = (bool)((byte)(uVar40 >> 8) & 1);
            auVar69._32_4_ = (uint)bVar5 * auVar70._32_4_ | (uint)!bVar5 * auVar68._32_4_;
            bVar5 = (bool)((byte)(uVar40 >> 9) & 1);
            auVar69._36_4_ = (uint)bVar5 * auVar70._36_4_ | (uint)!bVar5 * auVar68._36_4_;
            bVar5 = (bool)((byte)(uVar40 >> 10) & 1);
            auVar69._40_4_ = (uint)bVar5 * auVar70._40_4_ | (uint)!bVar5 * auVar68._40_4_;
            bVar5 = (bool)((byte)(uVar40 >> 0xb) & 1);
            auVar69._44_4_ = (uint)bVar5 * auVar70._44_4_ | (uint)!bVar5 * auVar68._44_4_;
            bVar5 = (bool)((byte)(uVar40 >> 0xc) & 1);
            auVar69._48_4_ = (uint)bVar5 * auVar70._48_4_ | (uint)!bVar5 * auVar68._48_4_;
            bVar5 = (bool)((byte)(uVar40 >> 0xd) & 1);
            auVar69._52_4_ = (uint)bVar5 * auVar70._52_4_ | (uint)!bVar5 * auVar68._52_4_;
            bVar5 = (bool)((byte)(uVar40 >> 0xe) & 1);
            auVar69._56_4_ = (uint)bVar5 * auVar70._56_4_ | (uint)!bVar5 * auVar68._56_4_;
            bVar5 = SUB81(uVar40 >> 0xf,0);
            auVar69._60_4_ = (uint)bVar5 * auVar70._60_4_ | (uint)!bVar5 * auVar68._60_4_;
            auVar68 = vblendmps_avx512f(auVar93,auVar69);
            bVar5 = (bool)((byte)uVar39 & 1);
            bVar7 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar39 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar39 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar39 >> 7) & 1);
            bVar22 = (bool)((byte)(uVar39 >> 8) & 1);
            bVar24 = (bool)((byte)(uVar39 >> 9) & 1);
            bVar26 = (bool)((byte)(uVar39 >> 10) & 1);
            bVar28 = (bool)((byte)(uVar39 >> 0xb) & 1);
            bVar30 = (bool)((byte)(uVar39 >> 0xc) & 1);
            bVar32 = (bool)((byte)(uVar39 >> 0xd) & 1);
            bVar34 = (bool)((byte)(uVar39 >> 0xe) & 1);
            bVar36 = SUB81(uVar39 >> 0xf,0);
            bVar6 = (bool)((byte)uVar53 & 1);
            bVar8 = (bool)((byte)(uVar53 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar53 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar53 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar53 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar53 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar53 >> 6) & 1);
            bVar20 = (bool)((byte)(uVar53 >> 7) & 1);
            bVar23 = (bool)((byte)(uVar53 >> 8) & 1);
            bVar25 = (bool)((byte)(uVar53 >> 9) & 1);
            bVar27 = (bool)((byte)(uVar53 >> 10) & 1);
            bVar29 = (bool)((byte)(uVar53 >> 0xb) & 1);
            bVar31 = (bool)((byte)(uVar53 >> 0xc) & 1);
            bVar33 = (bool)((byte)(uVar53 >> 0xd) & 1);
            bVar35 = (bool)((byte)(uVar53 >> 0xe) & 1);
            bVar37 = SUB81(uVar53 >> 0xf,0);
            *puVar43 = (uint)bVar6 * ((uint)bVar5 * auVar68._0_4_ | !bVar5 * auVar69._0_4_) |
                       (uint)!bVar6 * (uint)((byte)uVar54 & 1) * auVar74._0_4_;
            puVar43[1] = (uint)bVar8 * ((uint)bVar7 * auVar68._4_4_ | !bVar7 * auVar69._4_4_) |
                         (uint)!bVar8 * (uint)((byte)(uVar54 >> 1) & 1) * auVar74._4_4_;
            puVar43[2] = (uint)bVar10 * ((uint)bVar9 * auVar68._8_4_ | !bVar9 * auVar69._8_4_) |
                         (uint)!bVar10 * (uint)((byte)(uVar54 >> 2) & 1) * auVar74._8_4_;
            puVar43[3] = (uint)bVar12 * ((uint)bVar11 * auVar68._12_4_ | !bVar11 * auVar69._12_4_) |
                         (uint)!bVar12 * (uint)((byte)(uVar54 >> 3) & 1) * auVar74._12_4_;
            puVar43[4] = (uint)bVar14 * ((uint)bVar13 * auVar68._16_4_ | !bVar13 * auVar69._16_4_) |
                         (uint)!bVar14 * (uint)((byte)(uVar54 >> 4) & 1) * auVar74._16_4_;
            puVar43[5] = (uint)bVar16 * ((uint)bVar15 * auVar68._20_4_ | !bVar15 * auVar69._20_4_) |
                         (uint)!bVar16 * (uint)((byte)(uVar54 >> 5) & 1) * auVar74._20_4_;
            puVar43[6] = (uint)bVar18 * ((uint)bVar17 * auVar68._24_4_ | !bVar17 * auVar69._24_4_) |
                         (uint)!bVar18 * (uint)((byte)(uVar54 >> 6) & 1) * auVar74._24_4_;
            puVar43[7] = (uint)bVar20 * ((uint)bVar19 * auVar68._28_4_ | !bVar19 * auVar69._28_4_) |
                         (uint)!bVar20 * (uint)((byte)(uVar54 >> 7) & 1) * auVar74._28_4_;
            puVar43[8] = (uint)bVar23 * ((uint)bVar22 * auVar68._32_4_ | !bVar22 * auVar69._32_4_) |
                         (uint)!bVar23 * (uint)((byte)(uVar54 >> 8) & 1) * auVar74._32_4_;
            puVar43[9] = (uint)bVar25 * ((uint)bVar24 * auVar68._36_4_ | !bVar24 * auVar69._36_4_) |
                         (uint)!bVar25 * (uint)((byte)(uVar54 >> 9) & 1) * auVar74._36_4_;
            puVar43[10] = (uint)bVar27 * ((uint)bVar26 * auVar68._40_4_ | !bVar26 * auVar69._40_4_)
                          | (uint)!bVar27 * (uint)((byte)(uVar54 >> 10) & 1) * auVar74._40_4_;
            puVar43[0xb] = (uint)bVar29 * ((uint)bVar28 * auVar68._44_4_ | !bVar28 * auVar69._44_4_)
                           | (uint)!bVar29 * (uint)((byte)(uVar54 >> 0xb) & 1) * auVar74._44_4_;
            puVar43[0xc] = (uint)bVar31 * ((uint)bVar30 * auVar68._48_4_ | !bVar30 * auVar69._48_4_)
                           | (uint)!bVar31 * (uint)((byte)(uVar54 >> 0xc) & 1) * auVar74._48_4_;
            puVar43[0xd] = (uint)bVar33 * ((uint)bVar32 * auVar68._52_4_ | !bVar32 * auVar69._52_4_)
                           | (uint)!bVar33 * (uint)((byte)(uVar54 >> 0xd) & 1) * auVar74._52_4_;
            puVar43[0xe] = (uint)bVar35 * ((uint)bVar34 * auVar68._56_4_ | !bVar34 * auVar69._56_4_)
                           | (uint)!bVar35 * (uint)((byte)(uVar54 >> 0xe) & 1) * auVar74._56_4_;
            puVar43[0xf] = (uint)bVar37 * ((uint)bVar36 * auVar68._60_4_ | !bVar36 * auVar69._60_4_)
                           | (uint)!bVar37 * (uint)(byte)(uVar54 >> 0xf) * auVar74._60_4_;
            pauVar50 = pauVar50 + 1;
            puVar43 = puVar43 + 0x10;
            iVar44 = iVar44 + 0x10;
            uVar42 = local_254;
          } while (iVar44 < (int)uVar45);
        }
        local_140 = local_180._0_32_;
        if ((int)(uVar42 | 7) < (int)uVar45) {
          uVar41 = uVar42;
          do {
            uVar83 = *(undefined8 *)*pauVar50;
            uVar82 = *(undefined8 *)(*pauVar50 + 8);
            local_200 = *(__m128 *)*pauVar50;
            uVar84 = *(undefined8 *)(*pauVar50 + 0x10);
            uVar85 = *(undefined8 *)(*pauVar50 + 0x18);
            afStack_1f0 = (float  [2])uVar84;
            afStack_1e8 = (float  [2])uVar85;
            BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                      (local_240,(__m256 *)local_200,&local_140);
            *(undefined8 *)puVar43 = uVar83;
            *(undefined8 *)(puVar43 + 2) = uVar82;
            *(undefined8 *)(puVar43 + 4) = uVar84;
            *(undefined8 *)(puVar43 + 6) = uVar85;
            pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
            puVar43 = puVar43 + 8;
            uVar42 = uVar41 + 8;
            iVar44 = uVar41 + 0xf;
            uVar41 = uVar42;
          } while (iVar44 < (int)uVar45);
        }
        auVar93 = vmovdqa64_avx512f(_local_180);
        local_200 = auVar93._0_16_;
        uVar41 = uVar42 | 3;
        while ((int)uVar41 < (int)uVar45) {
          local_220 = *(float (*) [2])*pauVar50;
          uVar83 = *(undefined8 *)(*pauVar50 + 8);
          afStack_218 = (float  [2])uVar83;
          afVar100 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                               (local_240,(__m128 *)local_220,&local_200);
          *(long *)puVar43 = afVar100._0_8_;
          *(undefined8 *)(puVar43 + 2) = uVar83;
          pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
          puVar43 = puVar43 + 4;
          uVar41 = uVar42 + 7;
          uVar42 = uVar42 + 4;
        }
        if ((int)uVar42 < (int)uVar45) {
          lVar48 = 0;
          do {
            fVar78 = atan2f((float)local_190._0_4_,*(float *)(*pauVar50 + lVar48 * 4));
            puVar43[lVar48] = (uint)fVar78;
            lVar48 = lVar48 + 1;
          } while (uVar45 - uVar42 != (int)lVar48);
        }
        local_260 = local_260 + 1;
        auVar99 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar53 = (ulong)local_26a;
        auVar55 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar58 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar59 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar60 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar61 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar62 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar63 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar64 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar65 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar66 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar67 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar93 = local_100;
      } while (local_260 != local_268);
      return 0;
    }
    iVar44 = m->c;
    if ((long)iVar44 < 1) {
      return 0;
    }
    uVar45 = m->h * m->w * m->d * m->elempack;
    auVar93 = vbroadcastss_avx512f(auVar98);
    lVar48 = 0;
    do {
      pauVar50 = (undefined1 (*) [64])(m->cstep * lVar48 * m->elemsize + (long)m->data);
      pauVar46 = (undefined1 (*) [64])
                 (pMVar4->cstep * lVar48 * pMVar4->elemsize + (long)pMVar4->data);
      if ((int)uVar45 < 0x10) {
        uVar42 = 0;
      }
      else {
        iVar49 = 0xf;
        do {
          auVar55 = vaddps_avx512f(auVar93,*pauVar50);
          *pauVar46 = auVar55;
          pauVar50 = pauVar50 + 1;
          pauVar46 = pauVar46 + 1;
          iVar49 = iVar49 + 0x10;
          uVar42 = uVar45 & 0xfffffff0;
        } while (iVar49 < (int)uVar45);
      }
      uVar41 = uVar42 | 7;
      while ((int)uVar41 < (int)uVar45) {
        auVar92._0_4_ = auVar93._0_4_ + *(float *)*pauVar50;
        auVar92._4_4_ = auVar93._4_4_ + *(float *)(*pauVar50 + 4);
        auVar92._8_4_ = auVar93._8_4_ + *(float *)(*pauVar50 + 8);
        auVar92._12_4_ = auVar93._12_4_ + *(float *)(*pauVar50 + 0xc);
        auVar92._16_4_ = auVar93._16_4_ + *(float *)(*pauVar50 + 0x10);
        auVar92._20_4_ = auVar93._20_4_ + *(float *)(*pauVar50 + 0x14);
        auVar92._24_4_ = auVar93._24_4_ + *(float *)(*pauVar50 + 0x18);
        auVar92._28_4_ = auVar93._28_4_ + *(float *)(*pauVar50 + 0x1c);
        *(undefined1 (*) [32])*pauVar46 = auVar92;
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
        pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x20);
        uVar41 = uVar42 + 0xf;
        uVar42 = uVar42 + 8;
      }
      uVar41 = uVar42 | 3;
      while ((int)uVar41 < (int)uVar45) {
        auVar90._0_4_ = auVar93._0_4_ + *(float *)*pauVar50;
        auVar90._4_4_ = auVar93._4_4_ + *(float *)(*pauVar50 + 4);
        auVar90._8_4_ = auVar93._8_4_ + *(float *)(*pauVar50 + 8);
        auVar90._12_4_ = auVar93._12_4_ + *(float *)(*pauVar50 + 0xc);
        *(undefined1 (*) [16])*pauVar46 = auVar90;
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
        pauVar46 = (undefined1 (*) [64])((long)*pauVar46 + 0x10);
        uVar41 = uVar42 + 7;
        uVar42 = uVar42 + 4;
      }
      if (uVar45 - uVar42 != 0 && (int)uVar42 <= (int)uVar45) {
        lVar47 = 0;
        do {
          *(float *)((long)*pauVar46 + lVar47 * 4) = fVar78 + *(float *)(*pauVar50 + lVar47 * 4);
          lVar47 = lVar47 + 1;
        } while (uVar45 - uVar42 != (int)lVar47);
      }
      lVar48 = lVar48 + 1;
    } while (lVar48 != iVar44);
    return 0;
  }
  iVar2 = m->dims;
  iVar3 = b->dims;
  if ((((iVar2 == iVar3) && (m->w == uVar41)) &&
      ((m->h == iVar44 && ((m->d == iVar49 && (m->c == iVar1)))))) && (m->elempack == uVar42)) {
    binary_op_no_broadcast(m,b,pMVar4,uVar45,opt_00);
    return 0;
  }
  if (iVar3 < iVar2) {
LAB_00387dc2:
    binary_op_broadcast_inner(m,b,pMVar4,uVar45,opt_00);
    return 0;
  }
  if (iVar2 == 2) {
    if ((uVar41 == 1) && (iVar44 == m->h)) goto LAB_00387dc2;
LAB_00387e2e:
    bVar5 = false;
LAB_00387e31:
    bVar6 = false;
  }
  else {
    if (iVar2 == 4) {
      bVar5 = true;
      if ((uVar41 == 1) &&
         (((iVar44 == 1 &&
           (((iVar49 == 1 && (iVar1 == m->c)) || ((iVar49 == m->d && (iVar1 == m->c)))))) ||
          (((iVar44 == m->h && (iVar49 == m->d)) && (iVar1 == m->c)))))) goto LAB_00387dc2;
      goto LAB_00387e31;
    }
    if (iVar2 != 3) goto LAB_00387e2e;
    bVar6 = true;
    if ((uVar41 == 1) &&
       (((iVar44 == 1 && (iVar1 == m->c)) || ((iVar44 == m->h && (iVar1 == m->c))))))
    goto LAB_00387dc2;
    bVar5 = false;
  }
  if (uVar42 == 1) {
    if (((iVar2 == 2) && (iVar44 == 1)) && (uVar41 == m->w)) {
LAB_00387ea6:
      binary_op_broadcast_outer(m,b,pMVar4,uVar45,opt_00);
      return 0;
    }
    if (bVar6) {
      uVar42 = m->w;
      opt_00 = (Option *)(ulong)uVar42;
      if ((((iVar1 == 1) && (iVar44 == 1)) && (uVar41 == uVar42)) ||
         (((uVar41 == uVar42 && (iVar1 == 1)) && (iVar44 == m->h)))) goto LAB_00387ea6;
    }
    if (bVar5) {
      uVar42 = m->w;
      opt_00 = (Option *)(ulong)uVar42;
      if (((((iVar1 == 1) && (iVar49 == 1)) && (iVar44 == 1)) && (uVar41 == uVar42)) ||
         ((uVar41 == uVar42 &&
          ((((iVar1 == 1 && (iVar49 == 1)) && (iVar44 == m->h)) ||
           (((iVar44 == m->h && (iVar1 == 1)) && (iVar49 == m->d)))))))) goto LAB_00387ea6;
    }
  }
  if (!bVar6 || iVar3 != 3) {
    return 0;
  }
  if (iVar44 != 1) {
    return 0;
  }
  if (m->w != uVar41) {
    return 0;
  }
  if (m->c != iVar1) {
    return 0;
  }
  binary_op_broadcast_20(m,b,pMVar4,uVar45,opt_00);
  return 0;
}

Assistant:

int BinaryOp_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const bool b_is_scalar = bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack == 1;
    const bool a_rank_is_lower = bottom_blobs[0].dims < bottom_blobs[1].dims && !b_is_scalar;
    const bool a_size_is_lower = bottom_blobs[0].w * bottom_blobs[0].h * bottom_blobs[0].d * bottom_blobs[0].c * bottom_blobs[0].elempack < bottom_blobs[1].w * bottom_blobs[1].h * bottom_blobs[1].d * bottom_blobs[1].c * bottom_blobs[1].elempack;
    const bool a_is_lower = a_rank_is_lower || (!a_rank_is_lower && a_size_is_lower);
    const Mat& A = a_is_lower ? bottom_blobs[1] : bottom_blobs[0];
    const Mat& B = a_is_lower ? bottom_blobs[0] : bottom_blobs[1];
    const int op_type_r = a_is_lower ? get_reverse_op_type(op_type) : op_type;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(A, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // B is a scalar
    if (B.w * B.h * B.d * B.c * B.elempack == 1)
    {
        return binary_op_scalar(A, B[0], top_blob, op_type_r, opt);
    }

    // no broadcast
    if (A.dims == B.dims && A.w == B.w && A.h == B.h && A.d == B.d && A.c == B.c && A.elempack == B.elempack)
    {
        return binary_op_no_broadcast(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for inner axis
    if ((B.dims < A.dims)
            || (A.dims == 2 && B.w == 1 && B.h == A.h)
            || (A.dims == 3 && B.w == 1 && B.h == 1 && B.c == A.c)
            || (A.dims == 3 && B.w == 1 && B.h == A.h && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == 1 && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == 1 && B.d == A.d && B.c == A.c)
            || (A.dims == 4 && B.w == 1 && B.h == A.h && B.d == A.d && B.c == A.c))
    {
        return binary_op_broadcast_inner(A, B, top_blob, op_type_r, opt);
    }

    // broadcast B for outer axis
    if (B.elempack == 1 && ((A.dims == 2 && B.w == A.w && B.h == 1) || (A.dims == 3 && B.w == A.w && B.h == 1 && B.c == 1) || (A.dims == 3 && B.w == A.w && B.h == A.h && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == 1 && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == 1 && B.c == 1) || (A.dims == 4 && B.w == A.w && B.h == A.h && B.d == A.d && B.c == 1)))
    {
        return binary_op_broadcast_outer(A, B, top_blob, op_type_r, opt);
    }

    // some special broadcast rule here
    if (A.dims == 3 && B.dims == 3 && A.w == B.w && B.h == 1 && A.c == B.c)
    {
        return binary_op_broadcast_20(A, B, top_blob, op_type_r, opt);
    }

    return 0;
}